

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

void Js::JavascriptArray::MergeSort<unsigned_short>
               (unsigned_short *list,uint32 length,CompareVarsInfo *cvInfo,ArenaAllocator *allocator
               )

{
  _func_bool_CompareVarsInfo_ptr_void_ptr_void_ptr *p_Var1;
  code *pcVar2;
  int iVar3;
  uint uVar4;
  bool bVar5;
  BOOL BVar6;
  uint uVar7;
  undefined4 *puVar8;
  char *pcVar9;
  unsigned_short *puVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  uint uVar16;
  long lVar17;
  ulong local_70;
  unsigned_short local_34;
  unsigned_short local_32 [4];
  unsigned_short rightElement;
  
  p_Var1 = cvInfo->compareType;
  if (length == 0) {
    pcVar9 = &DAT_00000008;
  }
  else {
    BVar6 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar6 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar5) goto LAB_00bb0e55;
      *puVar8 = 0;
    }
    pcVar9 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             AllocInternal(&allocator->
                            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                           ,(ulong)length * 2);
    if (pcVar9 == (char *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar5) {
LAB_00bb0e55:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar8 = 0;
    }
  }
  if (2 < length * 2) {
    uVar4 = 2;
    uVar13 = 1;
    do {
      uVar7 = uVar4;
      if (length != 0) {
        uVar12 = 0;
        uVar4 = uVar13;
        do {
          uVar16 = uVar12 + uVar13;
          if (uVar16 < length) {
            local_70 = (ulong)(uVar16 - 1);
            puVar10 = list + local_70;
            bVar5 = (*p_Var1)(cvInfo,list + uVar16,puVar10);
            if (bVar5) {
              uVar11 = uVar12 + uVar7;
              if (length <= uVar12 + uVar7) {
                uVar11 = length;
              }
              uVar14 = 0xffffffff;
              if (uVar16 < uVar11) {
                lVar15 = 0;
                do {
                  *(unsigned_short *)(pcVar9 + lVar15 * 2) = list[(ulong)uVar4 + lVar15];
                  lVar17 = (ulong)uVar4 + lVar15;
                  lVar15 = lVar15 + 1;
                } while (lVar17 + 1U < (ulong)uVar11);
                uVar16 = uVar4 + (int)lVar15;
                uVar14 = (int)lVar15 - 1;
              }
              local_32[0] = *(unsigned_short *)(pcVar9 + (ulong)uVar14 * 2);
              while( true ) {
                local_34 = *puVar10;
                lVar15 = 0;
                while( true ) {
                  lVar17 = (ulong)uVar14 + lVar15;
                  bVar5 = (*p_Var1)(cvInfo,local_32,&local_34);
                  iVar3 = (int)lVar15;
                  uVar11 = (uVar16 - 1) + iVar3;
                  if (bVar5) break;
                  list[uVar11] = local_32[0];
                  if ((int)lVar17 == 0) {
                    uVar16 = (uVar16 + iVar3) - 1;
                    goto LAB_00bb0dd9;
                  }
                  local_32[0] = *(unsigned_short *)(pcVar9 + (ulong)(iVar3 + (uVar14 - 1)) * 2);
                  lVar15 = lVar15 + -1;
                }
                list[uVar11] = local_34;
                if ((uint)local_70 <= uVar12) break;
                uVar14 = uVar14 + iVar3;
                uVar16 = (uVar16 - 1) + iVar3;
                local_70 = (ulong)((uint)local_70 - 1);
                puVar10 = list + local_70;
              }
              uVar16 = (uVar16 + iVar3) - 2;
              list[uVar16] = local_32[0];
LAB_00bb0dd9:
              if (uVar14 + iVar3 != 0) {
                do {
                  uVar16 = uVar16 - 1;
                  list[uVar16] = *(unsigned_short *)(pcVar9 + lVar17 * 2 + -2);
                  lVar17 = lVar17 + -1;
                } while (lVar17 != 0);
              }
            }
          }
          uVar12 = uVar12 + uVar7;
          uVar4 = uVar4 + uVar7;
        } while (uVar12 < length);
      }
      uVar4 = uVar7 * 2;
      uVar13 = uVar7;
    } while (uVar7 * 2 < length * 2);
  }
  return;
}

Assistant:

void JavascriptArray::MergeSort(T* list, uint32 length, JavascriptArray::CompareVarsInfo* cvInfo, ArenaAllocator* allocator)
    {
        bool (*compareType)(JavascriptArray::CompareVarsInfo*, const void*, const void*) = cvInfo->compareType;
        T* buffer = AnewArray(allocator, T, length);
        uint32 bucketSize = 2, lastSize = 1, position = 0, left = 0, mid = 0, right = 0, i = 0, j = 0, k = 0;
        uint32 doubleLength = length + length;
        T rightElement, leftElement;

        while (bucketSize < doubleLength)
        {
            while (position < length)
            {
                left = position;
                mid = left + lastSize;

                // perform a merge but only if it's necessary
                if (mid < length && compareType (cvInfo, &list[mid], &list[mid - 1]))
                {
                    right = position + bucketSize;
                    right = right < length ? right : length;
                    i = mid - 1, j = 0, k = mid;

                    while (k < right)
                    {
                        buffer[j++] = list[k++];
                    }
    
                    rightElement = buffer[--j];
                    leftElement = list[i];

                    for (;;)
                    {
                        if (compareType (cvInfo, &rightElement, &leftElement))
                        {
                            list[--k] = leftElement;
                            if (i > left)
                            {
                                leftElement = list[--i];
                            }
                            else
                            {
                                list[--k] = rightElement;
                                break;
                            }
                        }
                        else
                        {
                            list[--k] = rightElement;
                            if (j > 0)
                            {
                                rightElement = buffer[--j];
                            }
                            else
                            {
                                break;
                            }
                        }
                    }

                    while (j > 0)
                    {
                        list[--k] = buffer[--j];
                    }
                }  
                position += bucketSize;
            }
            position = 0;
            lastSize = bucketSize;
            bucketSize *= 2;
        }
    }